

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_states.hpp
# Opt level: O2

event_set *
afsm::detail::state_base_impl<afsm::test::ortho_sm_def::off,_false>::static_handled_events(void)

{
  int iVar1;
  
  if ((state_base_impl<afsm::test::ortho_sm_def::off,false>::static_handled_events()::evts_ == '\0')
     && (iVar1 = __cxa_guard_acquire(&state_base_impl<afsm::test::ortho_sm_def::off,false>::
                                      static_handled_events()::evts_), iVar1 != 0)) {
    static_handled_events::evts_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    static_handled_events::evts_._M_t._M_impl._0_8_ = 0;
    static_handled_events::evts_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    static_handled_events::evts_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    static_handled_events::evts_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &static_handled_events::evts_._M_t._M_impl.super__Rb_tree_header._M_header;
    static_handled_events::evts_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &static_handled_events::evts_._M_t._M_impl.super__Rb_tree_header._M_header;
    static_handled_events::evts_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __cxa_atexit(std::
                 set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
                 ::~set,&static_handled_events::evts_,&__dso_handle);
    __cxa_guard_release(&state_base_impl<afsm::test::ortho_sm_def::off,false>::
                         static_handled_events()::evts_);
  }
  return &static_handled_events::evts_;
}

Assistant:

static event_set const&
    static_handled_events()
    {
        static event_set evts_ = make_event_set(handled_events{});
        return evts_;
    }